

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h__02_Writer.cpp
# Opt level: O3

void __thiscall
AS_02::MXF::AS02IndexWriterVBR::AS02IndexWriterVBR(AS02IndexWriterVBR *this,Dictionary *d)

{
  ASDCP::MXF::Partition::Partition(&this->super_Partition,d);
  *(undefined ***)this = &PTR__AS02IndexWriterVBR_0016ae88;
  this->m_CurrentSegment = (IndexTableSegment *)0x0;
  (this->m_EditRate).super_Rational.Numerator = 0;
  (this->m_EditRate).super_Rational.Denominator = 0;
  (this->m_EditRate).super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_0016b048;
  this->m_Dict = d;
  this->m_Lookup = (IPrimerLookup *)0x0;
  *(undefined4 *)&this->field_0xc0 = 0;
  *(undefined4 *)&this->field_0xb0 = 0x81;
  *(undefined2 *)&this->field_0x82 = 3;
  return;
}

Assistant:

AS_02::MXF::AS02IndexWriterVBR::AS02IndexWriterVBR(const ASDCP::Dictionary* d) :
  Partition(d), m_CurrentSegment(0), m_Dict(d), m_Lookup(0)
{
  BodySID = 0;
  IndexSID = 129;
  MinorVersion = 3;
}